

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afg2ampl.cpp
# Opt level: O0

int swig_main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  runtime_error *prVar3;
  FILE *__stream;
  size_type sVar4;
  uint *puVar5;
  reference pIVar6;
  pointer *ppiVar7;
  reference pAVar8;
  runtime_error *e;
  Arc *a;
  iterator __end1_4;
  iterator __begin1_4;
  vector<Arc,_std::allocator<Arc>_> *__range1_4;
  int i_4;
  Item *item_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<Item,_std::allocator<Item>_> *__range1_3;
  Item *item_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Item,_std::allocator<Item>_> *__range1_2;
  Item *item_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Item,_std::allocator<Item>_> *__range1_1;
  Item *item;
  iterator __end2;
  iterator __begin2;
  vector<Item,_std::allocator<Item>_> *__range2;
  int i_3;
  int i_2;
  size_t i_1;
  size_t i;
  iterator iStack_5c8;
  int t;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  char *model;
  char _error_msg__2 [256];
  FILE *fdat;
  char _error_msg__1 [256];
  FILE *fmod;
  Instance *inst;
  Arcflow afg;
  char _error_msg_ [256];
  char **argv_local;
  int argc_local;
  
  printf("VPSolver 3.1.3, Copyright (C) 2013-2022, Filipe Brandao\n");
  setvbuf(_stdout,(char *)0x0,2,0);
  if (argc == 4) {
    bVar2 = check_ext(argv[1],".afg");
    if (!bVar2) {
      snprintf((char *)&afg.LOSS,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "check_ext(argv[1], \".afg\")",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2ampl.cpp"
               ,0x12);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,(char *)&afg.LOSS);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Arcflow::Arcflow((Arcflow *)&inst,argv[1]);
    _error_msg__1._248_8_ = fopen(argv[2],"w");
    if ((FILE *)_error_msg__1._248_8_ == (FILE *)0x0) {
      perror("fopen");
    }
    if (_error_msg__1._248_8_ == 0) {
      snprintf((char *)&fdat,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fmod != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2ampl.cpp"
               ,0x1a);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,(char *)&fdat);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __stream = fopen(argv[3],"w");
    if (_error_msg__1._248_8_ == 0) {
      perror("fopen");
    }
    if (__stream == (FILE *)0x0) {
      snprintf((char *)&model,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fdat != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2ampl.cpp"
               ,0x20);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,(char *)&model);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    printf("Generating the .mod file...");
    fprintf((FILE *)_error_msg__1._248_8_,"%s",
            "set Items;\nparam Demand{Items};\nset Labels;\nparam ItemId{Labels};\nparam ItemOpt{Labels};\n\nset V;\nset A dimen 3;\nparam S;\nparam LOSS;\nparam ArcId{A};\nparam ArcBounds{Labels union {LOSS}} default +Infinity;\nvar Flow{(u,v,l) in A} integer >= 0 <= ArcBounds[l];\nset Targets;\nparam Cost{Targets};\nparam Quantity{Targets};\n\nminimize TotalCost:\n    sum{t in Targets} Cost[t] * Flow[t,S,LOSS];\ns.t. BinQuantity{t in Targets: Quantity[t] >= 0}:\n    Flow[t,S,LOSS] <= Quantity[t];\nparam RelaxDomains default 1;\ns.t. SatisfyDemandStrict{i in Items: RelaxDomains != 1}:\n    sum{l in Labels : ItemId[l]==i} sum{(u,v,l) in A} Flow[u,v,l] == Demand[i];\ns.t. SatisfyDemandRelaxed{i in Items: RelaxDomains == 1}:\n    sum{l in Labels : ItemId[l]==i} sum{(u,v,l) in A} Flow[u,v,l] >= Demand[i];\ns.t. FlowConservation{k in V}:\n    (sum{(u,v,l) in A: v == k} Flow[u,v,l]) - (sum{(u,v,l) in A: u == k} Flow[u,v,l]) == 0;"
           );
    fclose((FILE *)_error_msg__1._248_8_);
    printf("Generating the .dat file...");
    fprintf(__stream,"data;\n");
    fprintf(__stream,"set Targets :=");
    __end1 = std::vector<int,_std::allocator<int>_>::begin(&afg.S);
    iStack_5c8 = std::vector<int,_std::allocator<int>_>::end(&afg.S);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffa38);
      if (!bVar2) break;
      puVar5 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&__end1);
      fprintf(__stream," %d",(ulong)*puVar5);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1);
    }
    fprintf(__stream,";\n");
    fprintf(__stream,"param Cost :=");
    i_1 = 0;
    while( true ) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&afg.S);
      if (sVar4 <= i_1) break;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)&afg.S,i_1);
      uVar1 = *puVar5;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &afg.inst.Ws.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,i_1);
      fprintf(__stream," %d %d",(ulong)uVar1,(ulong)*puVar5);
      i_1 = i_1 + 1;
    }
    fprintf(__stream,";\n");
    fprintf(__stream,"param Quantity :=");
    _i_3 = 0;
    while( true ) {
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&afg.S);
      if (sVar4 <= _i_3) break;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)&afg.S,_i_3);
      uVar1 = *puVar5;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &afg.inst.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage,_i_3);
      fprintf(__stream," %d %d",(ulong)uVar1,(ulong)*puVar5);
      _i_3 = _i_3 + 1;
    }
    fprintf(__stream,";\n");
    fprintf(__stream,"set Items :=");
    for (__range2._4_4_ = 0; __range2._4_4_ < afg.inst.nbtypes; __range2._4_4_ = __range2._4_4_ + 1)
    {
      fprintf(__stream," %d",(ulong)(__range2._4_4_ + 1));
    }
    fprintf(__stream,";\n");
    fprintf(__stream,"param Demand :=");
    for (__range2._0_4_ = 0; (int)__range2 < afg.inst.nbtypes; __range2._0_4_ = (int)__range2 + 1) {
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &afg.inst.nopts.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (long)(int)__range2);
      fprintf(__stream," %d %d",(ulong)((int)__range2 + 1),(ulong)*puVar5);
    }
    fprintf(__stream,";\n");
    fprintf(__stream,"param RelaxDomains := %d;\n",
            (ulong)(afg.inst.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._5_1_ & 1));
    if ((afg.inst.items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
      fprintf(__stream,"param ArcBounds :=");
      ppiVar7 = &afg.inst.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      __end2 = std::vector<Item,_std::allocator<Item>_>::begin
                         ((vector<Item,_std::allocator<Item>_> *)ppiVar7);
      item = (Item *)std::vector<Item,_std::allocator<Item>_>::end
                               ((vector<Item,_std::allocator<Item>_> *)ppiVar7);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>
                                    *)&item);
        if (!bVar2) break;
        pIVar6 = __gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>::
                 operator*(&__end2);
        fprintf(__stream," %d %d",(ulong)(uint)pIVar6->id,(ulong)(uint)pIVar6->demand);
        __gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>::operator++
                  (&__end2);
      }
      fprintf(__stream,";\n");
    }
    fprintf(__stream,"set Labels :=");
    ppiVar7 = &afg.inst.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end1_1 = std::vector<Item,_std::allocator<Item>_>::begin
                         ((vector<Item,_std::allocator<Item>_> *)ppiVar7);
    item_1 = (Item *)std::vector<Item,_std::allocator<Item>_>::end
                               ((vector<Item,_std::allocator<Item>_> *)ppiVar7);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_> *)
                         &item_1);
      if (!bVar2) break;
      pIVar6 = __gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>::
               operator*(&__end1_1);
      fprintf(__stream," %d",(ulong)(uint)pIVar6->id);
      __gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>::operator++
                (&__end1_1);
    }
    fprintf(__stream,";\n");
    fprintf(__stream,"param ItemId :=");
    ppiVar7 = &afg.inst.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end1_2 = std::vector<Item,_std::allocator<Item>_>::begin
                         ((vector<Item,_std::allocator<Item>_> *)ppiVar7);
    item_2 = (Item *)std::vector<Item,_std::allocator<Item>_>::end
                               ((vector<Item,_std::allocator<Item>_> *)ppiVar7);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_2,
                         (__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_> *)
                         &item_2);
      if (!bVar2) break;
      pIVar6 = __gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>::
               operator*(&__end1_2);
      fprintf(__stream," %d %d",(ulong)(uint)pIVar6->id,(ulong)(pIVar6->type + 1));
      __gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>::operator++
                (&__end1_2);
    }
    fprintf(__stream,";\n");
    fprintf(__stream,"param ItemOpt :=");
    ppiVar7 = &afg.inst.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end1_3 = std::vector<Item,_std::allocator<Item>_>::begin
                         ((vector<Item,_std::allocator<Item>_> *)ppiVar7);
    item_3 = (Item *)std::vector<Item,_std::allocator<Item>_>::end
                               ((vector<Item,_std::allocator<Item>_> *)ppiVar7);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_3,
                         (__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_> *)
                         &item_3);
      if (!bVar2) break;
      pIVar6 = __gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>::
               operator*(&__end1_3);
      fprintf(__stream," %d %d",(ulong)(uint)pIVar6->id,(ulong)(pIVar6->opt + 1));
      __gnu_cxx::__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>::operator++
                (&__end1_3);
    }
    fprintf(__stream,";\n");
    fprintf(__stream,"param S := %d;\n",(ulong)(uint)afg.NV);
    fprintf(__stream,"param LOSS := %d;\n",
            (ulong)(uint)afg.A.super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    fprintf(__stream,"set V :=");
    for (__range1_4._4_4_ = 0;
        (int)__range1_4._4_4_ <
        (int)afg.inst.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; __range1_4._4_4_ = __range1_4._4_4_ + 1) {
      fprintf(__stream," %d",(ulong)__range1_4._4_4_);
    }
    fprintf(__stream,";\n");
    fprintf(__stream,"set A :=");
    ppiVar7 = &afg.Ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
    __end1_4 = std::vector<Arc,_std::allocator<Arc>_>::begin
                         ((vector<Arc,_std::allocator<Arc>_> *)ppiVar7);
    a = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::end
                         ((vector<Arc,_std::allocator<Arc>_> *)ppiVar7);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_4,
                         (__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> *)&a);
      if (!bVar2) break;
      pAVar8 = __gnu_cxx::__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::
               operator*(&__end1_4);
      fprintf(__stream," (%d, %d, %d)",(ulong)(uint)pAVar8->u,(ulong)(uint)pAVar8->v,
              (ulong)(uint)pAVar8->label);
      __gnu_cxx::__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::operator++
                (&__end1_4);
    }
    fprintf(__stream,";\n");
    fclose(__stream);
    printf("DONE!\n");
    argv_local._4_4_ = 0;
    Arcflow::~Arcflow((Arcflow *)&inst);
  }
  else {
    printf("Usage: afg2ampl graph.afg model.mod data.dat\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int swig_main(int argc, char **argv) {
	printf(PACKAGE_STRING", Copyright (C) 2013-2022, Filipe Brandao\n");
	setvbuf(stdout, NULL, _IONBF, 0);
	if (argc != 4) {
		printf("Usage: afg2ampl graph.afg model.mod data.dat\n");
		return 1;
	}
	try {
		throw_assert(check_ext(argv[1], ".afg"));
		Arcflow afg(argv[1]);
		Instance &inst = afg.inst;

		FILE *fmod = fopen(argv[2], "w");
		if (fmod == NULL) {
			perror("fopen");
		}
		throw_assert(fmod != NULL);

		FILE *fdat = fopen(argv[3], "w");
		if (fmod == NULL) {
			perror("fopen");
		}
		throw_assert(fdat != NULL);

		/* model file */
		printf("Generating the .mod file...");
		const char *model = \
			"set Items;\n"
			"param Demand{Items};\n"
			"set Labels;\n"
			"param ItemId{Labels};\n"
			"param ItemOpt{Labels};\n"
			"\n"
			"set V;\n"
			"set A dimen 3;\n"
			"param S;\n"
			"param LOSS;\n"
			"param ArcId{A};\n"
			"param ArcBounds{Labels union {LOSS}} default +Infinity;\n"
			"var Flow{(u,v,l) in A} integer >= 0 <= ArcBounds[l];\n"
			"set Targets;\n"
			"param Cost{Targets};\n"
			"param Quantity{Targets};\n"
			"\n"
			"minimize TotalCost:\n"
			"    sum{t in Targets} Cost[t] * Flow[t,S,LOSS];\n"
			"s.t. BinQuantity{t in Targets: Quantity[t] >= 0}:\n"
			"    Flow[t,S,LOSS] <= Quantity[t];\n"
			"param RelaxDomains default 1;\n"
			"s.t. SatisfyDemandStrict{i in Items: RelaxDomains != 1}:\n"
			"    sum{l in Labels : ItemId[l]==i} sum{(u,v,l) in A} Flow[u,v,l] == Demand[i];\n"
			"s.t. SatisfyDemandRelaxed{i in Items: RelaxDomains == 1}:\n"
			"    sum{l in Labels : ItemId[l]==i} sum{(u,v,l) in A} Flow[u,v,l] >= Demand[i];\n"
			"s.t. FlowConservation{k in V}:\n"
			"    (sum{(u,v,l) in A: v == k} Flow[u,v,l]) - (sum{(u,v,l) in A: u == k} Flow[u,v,l]) == 0;";
		fprintf(fmod, "%s", model);
		fclose(fmod);

		/* data file */
		printf("Generating the .dat file...");
		fprintf(fdat, "data;\n");
		fprintf(fdat, "set Targets :=");
		for (const int t : afg.Ts) {
			fprintf(fdat, " %d", t);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param Cost :=");
		for (size_t i = 0; i < afg.Ts.size(); i++) {
			fprintf(fdat, " %d %d", afg.Ts[i], inst.Cs[i]);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param Quantity :=");
		for (size_t i = 0; i < afg.Ts.size(); i++) {
			fprintf(fdat, " %d %d", afg.Ts[i], inst.Qs[i]);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "set Items :=");
		for (int i = 0; i < inst.m; i++) {
			fprintf(fdat, " %d", i+1);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param Demand :=");
		for (int i = 0; i < inst.m; i++) {
			fprintf(fdat, " %d %d", i+1, inst.demands[i]);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param RelaxDomains := %d;\n", inst.relax_domains);

		if (!inst.relax_domains) {
			fprintf(fdat, "param ArcBounds :=");
			for (const Item &item : inst.items) {
				fprintf(fdat, " %d %d", item.id, item.demand);
			}
			fprintf(fdat, ";\n");
		}

		fprintf(fdat, "set Labels :=");
		for (const Item &item : inst.items) {
			fprintf(fdat, " %d", item.id);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param ItemId :=");
		for (const Item &item : inst.items) {
			fprintf(fdat, " %d %d", item.id, item.type+1);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param ItemOpt :=");
		for (const Item &item : inst.items) {
			fprintf(fdat, " %d %d", item.id, item.opt+1);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "param S := %d;\n", afg.S);
		fprintf(fdat, "param LOSS := %d;\n", afg.LOSS);

		fprintf(fdat, "set V :=");
		for (int i = 0 ; i < afg.NV; i++) {
			fprintf(fdat, " %d", i);
		}
		fprintf(fdat, ";\n");

		fprintf(fdat, "set A :=");
		for (const Arc &a : afg.A) {
			fprintf(fdat, " (%d, %d, %d)", a.u, a.v, a.label);
		}
		fprintf(fdat, ";\n");
		fclose(fdat);

		printf("DONE!\n");
		return 0;
	} catch (const std::runtime_error &e) {
		printf("%s\n", e.what());
		return 1;
	} catch (...) {
		printf("UnknownError\n");
		return 1;
	}
}